

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

IVec4 __thiscall tcu::getTextureBorderColorInt(tcu *this,TextureFormat *format,Sampler *sampler)

{
  Channel ndx;
  int a;
  int iVar1;
  TextureSwizzle *pTVar2;
  int *piVar3;
  deInt32 *pdVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  IVec4 IVar6;
  int local_64;
  Channel map;
  int c;
  IVec4 valueMax;
  IVec4 valueMin;
  IVec4 channelBits;
  Channel *channelMap;
  TextureChannelClass channelClass;
  Sampler *sampler_local;
  TextureFormat *format_local;
  IVec4 *result;
  
  getTextureChannelClass(format->type);
  pTVar2 = getBorderColorReadSwizzle(format->order);
  getChannelBitDepth((tcu *)(valueMin.m_data + 2),format->type);
  getNBitSignedIntegerVec4MinValue((tcu *)(valueMax.m_data + 2),(IVec4 *)(valueMin.m_data + 2));
  getNBitSignedIntegerVec4MaxValue((tcu *)&map,(IVec4 *)(valueMin.m_data + 2));
  Vector<int,_4>::Vector((Vector<int,_4> *)this);
  uVar5 = extraout_RDX;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    ndx = pTVar2->components[local_64];
    if (ndx == CHANNEL_ZERO) {
      piVar3 = Vector<int,_4>::operator[]((Vector<int,_4> *)this,local_64);
      *piVar3 = 0;
      uVar5 = extraout_RDX_00;
    }
    else if (ndx == CHANNEL_ONE) {
      piVar3 = Vector<int,_4>::operator[]((Vector<int,_4> *)this,local_64);
      *piVar3 = 1;
      uVar5 = extraout_RDX_01;
    }
    else {
      pdVar4 = rr::GenericVec4::getAccess<int>(&sampler->borderColor);
      iVar1 = pdVar4[(int)ndx];
      piVar3 = Vector<int,_4>::operator[]((Vector<int,_4> *)(valueMax.m_data + 2),ndx);
      a = *piVar3;
      piVar3 = Vector<int,_4>::operator[]((Vector<int,_4> *)&map,ndx);
      iVar1 = de::clamp<int>(iVar1,a,*piVar3);
      piVar3 = Vector<int,_4>::operator[]((Vector<int,_4> *)this,local_64);
      *piVar3 = iVar1;
      uVar5 = extraout_RDX_02;
    }
  }
  IVar6.m_data[2] = (int)uVar5;
  IVar6.m_data[3] = (int)((ulong)uVar5 >> 0x20);
  IVar6.m_data._0_8_ = this;
  return (IVec4)IVar6.m_data;
}

Assistant:

static tcu::IVec4 getTextureBorderColorInt (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const IVec4						channelBits		= getChannelBitDepth(format.type);
	const IVec4						valueMin		= getNBitSignedIntegerVec4MinValue(channelBits);
	const IVec4						valueMax		= getNBitSignedIntegerVec4MaxValue(channelBits);
	IVec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER);
	DE_UNREF(channelClass);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1;
		else
		{
			// integer values are clamped to a representable range
			result[c] = de::clamp(sampler.borderColor.getAccess<deInt32>()[(int)map], valueMin[(int)map], valueMax[(int)map]);
		}
	}

	return result;
}